

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprintdialog_unix.cpp
# Opt level: O0

void __thiscall QUnixPrintWidgetPrivate::_q_printerChanged(QUnixPrintWidgetPrivate *this,int index)

{
  int iVar1;
  QPlatformPrinterSupport *pQVar2;
  OutputFormat in_ESI;
  QPrintDialogPrivate *in_RDI;
  long in_FS_OFFSET;
  QPlatformPrinterSupport *ps;
  int printerCount;
  QString filename;
  QPrintDevice *in_stack_fffffffffffffec8;
  QPrintDevice *in_stack_fffffffffffffed0;
  QString *pQVar3;
  QPrintDevice *in_stack_fffffffffffffed8;
  QPrintDevice *this_00;
  QPrintDevice *in_stack_fffffffffffffee0;
  undefined8 in_stack_fffffffffffffee8;
  OutputFormat OVar4;
  QPrinter *in_stack_fffffffffffffef0;
  QPrinter *this_01;
  QPrinter *in_stack_fffffffffffffef8;
  QPrintDialogPrivate *this_02;
  undefined1 local_88 [24];
  undefined1 local_70 [32];
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  long local_8;
  
  OVar4 = (OutputFormat)((ulong)in_stack_fffffffffffffee8 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (-1 < (int)in_ESI) {
    this_02 = in_RDI;
    iVar1 = QComboBox::count();
    QWidget::setEnabled(SUB81(*(undefined8 *)&(in_RDI->super_QAbstractPrintDialogPrivate).field_0x78
                              ,0));
    QWidget::setEnabled(SUB81(*(undefined8 *)&(in_RDI->super_QAbstractPrintDialogPrivate).field_0x68
                              ,0));
    if (*(long *)&(in_RDI->super_QAbstractPrintDialogPrivate).field_0x8 != 0) {
      in_stack_fffffffffffffef8 =
           *(QPrinter **)&(in_RDI->super_QAbstractPrintDialogPrivate).field_0x8;
      if (in_stack_fffffffffffffef8 != (QPrinter *)0x0) {
        (**(code **)(*(long *)in_stack_fffffffffffffef8 + 0x20))();
      }
      *(undefined8 *)&(in_RDI->super_QAbstractPrintDialogPrivate).field_0x8 = 0;
    }
    if ((((in_RDI->super_QAbstractPrintDialogPrivate).field_0xb0 & 1) == 0) ||
       (in_ESI != iVar1 - PdfFormat)) {
      if (*(long *)&(in_RDI->super_QAbstractPrintDialogPrivate).field_0x90 != 0) {
        QPrinter::setOutputFormat(in_stack_fffffffffffffef0,OVar4);
        pQVar2 = QPlatformPrinterSupportPlugin::get();
        if (pQVar2 == (QPlatformPrinterSupport *)0x0) {
          QPrintDevice::QPrintDevice(in_stack_fffffffffffffee0);
          QPrintDevice::operator=(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
          QPrintDevice::~QPrintDevice((QPrintDevice *)0x170ab3);
        }
        else {
          QComboBox::itemText((int)local_88);
          (*pQVar2->_vptr_QPlatformPrinterSupport[4])(local_70,pQVar2,local_88);
          QPrintDevice::operator=(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
          QPrintDevice::~QPrintDevice((QPrintDevice *)0x170a71);
          QString::~QString((QString *)0x170a7e);
        }
        QPrintDevice::id(in_stack_fffffffffffffed8);
        QPrinter::setPrinterName(in_stack_fffffffffffffef8,(QString *)in_stack_fffffffffffffef0);
        QString::~QString((QString *)0x170af5);
        pQVar3 = *(QString **)&(in_RDI->super_QAbstractPrintDialogPrivate).field_0x48;
        QPrintDevice::location(in_stack_fffffffffffffed8);
        QLabel::setText(pQVar3);
        QString::~QString((QString *)0x170b2d);
        this_00 = *(QPrintDevice **)&(in_RDI->super_QAbstractPrintDialogPrivate).field_0x60;
        QPrintDevice::makeAndModel(this_00);
        QLabel::setText((QString *)this_00);
        QString::~QString((QString *)0x170b65);
        if (*(long *)&(in_RDI->super_QAbstractPrintDialogPrivate).field_0xa8 != 0) {
          QPrintDialogPrivate::selectPrinter(this_02,in_ESI);
        }
      }
    }
    else {
      pQVar3 = *(QString **)&(in_RDI->super_QAbstractPrintDialogPrivate).field_0x48;
      QPrintDialog::tr((char *)in_stack_fffffffffffffed8,(char *)in_stack_fffffffffffffed0,
                       (int)((ulong)in_stack_fffffffffffffec8 >> 0x20));
      QLabel::setText(pQVar3);
      OVar4 = (OutputFormat)((ulong)pQVar3 >> 0x20);
      QString::~QString((QString *)0x170876);
      this_01 = *(QPrinter **)&(in_RDI->super_QAbstractPrintDialogPrivate).field_0x60;
      QPrintDialog::tr((char *)in_stack_fffffffffffffed8,(char *)in_stack_fffffffffffffed0,
                       (int)((ulong)in_stack_fffffffffffffec8 >> 0x20));
      QLabel::setText((QString *)this_01);
      QString::~QString((QString *)0x1708c0);
      QWidget::setEnabled(SUB81(*(undefined8 *)
                                 &(in_RDI->super_QAbstractPrintDialogPrivate).field_0x38,0));
      QWidget::setEnabled(SUB81(*(undefined8 *)
                                 &(in_RDI->super_QAbstractPrintDialogPrivate).field_0x78,0));
      local_50 = 0xaaaaaaaaaaaaaaaa;
      local_48 = 0xaaaaaaaaaaaaaaaa;
      local_40 = 0xaaaaaaaaaaaaaaaa;
      QLineEdit::text();
      QLineEdit::setText(*(QString **)&(in_RDI->super_QAbstractPrintDialogPrivate).field_0x78);
      QWidget::setEnabled(SUB81(*(undefined8 *)
                                 &(in_RDI->super_QAbstractPrintDialogPrivate).field_0x68,0));
      QPrinter::setOutputFormat(this_01,OVar4);
      QPrintDevice::QPrintDevice(in_stack_fffffffffffffee0);
      QPrintDevice::operator=(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
      QPrintDevice::~QPrintDevice((QPrintDevice *)0x17099b);
      if (*(long *)&(in_RDI->super_QAbstractPrintDialogPrivate).field_0xa8 != 0) {
        QPrintDialogPrivate::selectPrinter(this_02,in_ESI);
      }
      QString::~QString((QString *)0x1709cd);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QUnixPrintWidgetPrivate::_q_printerChanged(int index)
{
    if (index < 0)
        return;
    const int printerCount = widget.printers->count();
    widget.filename->setEnabled(false);
    widget.lOutput->setEnabled(false);

    // Reset properties dialog when printer is changed
    if (propertiesDialog){
        delete propertiesDialog;
        propertiesDialog = nullptr;
    }

#if QT_CONFIG(cups)
    m_duplexPpdOption = nullptr;
#endif

    if (filePrintersAdded) {
        Q_ASSERT(index != printerCount - 2); // separator
        if (index == printerCount - 1) { // PDF
            widget.location->setText(QPrintDialog::tr("Local file"));
            widget.type->setText(QPrintDialog::tr("Write PDF file"));
            widget.properties->setEnabled(true);
            widget.filename->setEnabled(true);
            QString filename = widget.filename->text();
            widget.filename->setText(filename);
            widget.lOutput->setEnabled(true);
            printer->setOutputFormat(QPrinter::PdfFormat);
            m_currentPrintDevice = QPrintDevice();
            if (optionsPane)
                optionsPane->selectPrinter(QPrinter::PdfFormat);
            return;
        }
    }

    if (printer) {
        printer->setOutputFormat(QPrinter::NativeFormat);

        QPlatformPrinterSupport *ps = QPlatformPrinterSupportPlugin::get();
        if (ps)
            m_currentPrintDevice = ps->createPrintDevice(widget.printers->itemText(index));
        else
            m_currentPrintDevice = QPrintDevice();

        printer->setPrinterName(m_currentPrintDevice.id());

        widget.location->setText(m_currentPrintDevice.location());
        widget.type->setText(m_currentPrintDevice.makeAndModel());
        if (optionsPane)
            optionsPane->selectPrinter(QPrinter::NativeFormat);
    }

#if QT_CONFIG(cups)
    m_duplexPpdOption = QCUPSSupport::findPpdOption("Duplex", &m_currentPrintDevice);
#endif
}